

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::ComputeBuiltinVarCase::iterate(ComputeBuiltinVarCase *this)

{
  UVec3 *b;
  ostringstream *poVar1;
  ostringstream *this_00;
  TestLog *log;
  glUniform2uivFunc p_Var2;
  bool bVar3;
  int ndx;
  int iVar4;
  deUint32 program;
  GLuint index;
  GLenum GVar5;
  GLint GVar6;
  undefined4 extraout_var;
  void *pvVar7;
  ulong uVar8;
  MessageBuilder *pMVar9;
  TestError *pTVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  IterateResult IVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  pointer localSize;
  UVec2 stride;
  UVec3 refLocalID;
  UVec3 refGroupID;
  UVec3 resValue;
  ScopedLogSection section;
  UVec3 refValue;
  UVec3 refGlobalID;
  Buffer outputBuffer;
  UVec3 globalSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  InterfaceVariableInfo outVarInfo;
  MessageBuilder local_330;
  MessageBuilder local_1b0;
  Functions *gl;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Iteration",(allocator<char> *)&refGroupID);
  de::toString<int>(&outVarInfo.name,&this->m_subCaseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_330,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                 &outVarInfo.name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"Iteration ",(allocator<char> *)&refLocalID);
  de::toString<int>((string *)&globalSize,&this->m_subCaseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputBuffer,
                 &local_3a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalSize);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&local_330,(string *)&outputBuffer)
  ;
  std::__cxx11::string::~string((string *)&outputBuffer);
  std::__cxx11::string::~string((string *)&globalSize);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&outVarInfo);
  std::__cxx11::string::~string((string *)&local_1b0);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  localSize = (this->m_subCases).
              super__Vector_base<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_subCaseNdx;
  program = getProgram(this,&localSize->localSize);
  b = &localSize->numWorkGroups;
  tcu::operator*((tcu *)&globalSize,&localSize->localSize,b);
  stride.m_data[0] = globalSize.m_data[1] * globalSize.m_data[0];
  stride.m_data[1] = globalSize.m_data[0];
  uVar16 = (localSize->localSize).m_data[1];
  uVar12 = (localSize->localSize).m_data[0];
  uVar13 = (localSize->localSize).m_data[2];
  uVar17 = (localSize->numWorkGroups).m_data[0];
  uVar11 = (localSize->numWorkGroups).m_data[1];
  uVar18 = (localSize->numWorkGroups).m_data[2];
  index = (*gl->getProgramResourceIndex)(program,0x92e5,"Output.result");
  glu::getProgramInterfaceVariableInfo(&outVarInfo,gl,program,0x92e5,index);
  uVar16 = outVarInfo.arrayStride * uVar16 * uVar12 * uVar13 * uVar17 * uVar11 * uVar18;
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&outputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  if (outVarInfo.arraySize != 0) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,(char *)0x0,"outVarInfo.arraySize == 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
               ,0xdd);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Number of work groups = ");
  tcu::operator<<((ostream *)poVar1,b);
  local_330.m_log =
       tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_00 = &local_330.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Work group size = ");
  tcu::operator<<((ostream *)this_00,&localSize->localSize);
  tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (*gl->bindBuffer)(0x90d2,outputBuffer.super_ObjectWrapper.m_object);
  uVar15 = (ulong)uVar16;
  (*gl->bufferData)(0x90d2,uVar15,(void *)0x0,0x88e1);
  (*gl->bindBufferBase)(0x90d2,0,outputBuffer.super_ObjectWrapper.m_object);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
                  ,0xe5);
  (*gl->useProgram)(program);
  p_Var2 = gl->uniform2uiv;
  GVar6 = (*gl->getUniformLocation)(program,"u_stride");
  (*p_Var2)(GVar6,1,stride.m_data);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Program setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
                  ,0xe9);
  (*gl->dispatchCompute)
            ((localSize->numWorkGroups).m_data[0],(localSize->numWorkGroups).m_data[1],
             (localSize->numWorkGroups).m_data[2]);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glDispatchCompute() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
                  ,0xec);
  pvVar7 = (*gl->mapBufferRange)(0x90d2,0,uVar15,1);
  uVar16 = glu::getDataTypeScalarSize(this->m_varType);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glMapBufferRange() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
                  ,0xf4);
  if (pvVar7 == (void *)0x0) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,(char *)0x0,"ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
               ,0xf5);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar4 = 0;
  uVar15 = 0;
  if (0 < (int)uVar16) {
    uVar15 = (ulong)uVar16;
  }
  poVar1 = &local_330.m_str;
  uVar12 = 0;
  do {
    if ((localSize->numWorkGroups).m_data[2] <= uVar12) {
      local_330.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_330.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," / ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," values passed");
      tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      if (0 < iVar4) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Comparison failed");
      }
      (*gl->unmapBuffer)(0x90d2);
      iVar4 = this->m_subCaseNdx + 1;
      this->m_subCaseNdx = iVar4;
      IVar14 = STOP;
      if (iVar4 < (int)(((long)(this->m_subCases).
                               super__Vector_base<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_subCases).
                              super__Vector_base<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        IVar14 = (IterateResult)
                 (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_testResult ==
                 QP_TEST_RESULT_PASS);
      }
      glu::ObjectWrapper::~ObjectWrapper(&outputBuffer.super_ObjectWrapper);
      std::__cxx11::string::~string((string *)&outVarInfo);
      tcu::ScopedLogSection::~ScopedLogSection(&section);
      return IVar14;
    }
    for (uVar13 = 0; uVar13 < (localSize->numWorkGroups).m_data[1]; uVar13 = uVar13 + 1) {
      for (uVar17 = 0; uVar17 < b->m_data[0]; uVar17 = uVar17 + 1) {
        for (uVar11 = 0; uVar11 < (localSize->localSize).m_data[2]; uVar11 = uVar11 + 1) {
          for (uVar18 = 0; uVar18 < (localSize->localSize).m_data[1]; uVar18 = uVar18 + 1) {
            uVar19 = 0;
            while( true ) {
              if ((localSize->localSize).m_data[0] <= uVar19) break;
              refLocalID.m_data[0] = uVar19;
              refLocalID.m_data[1] = uVar18;
              refLocalID.m_data[2] = uVar11;
              refGroupID.m_data[0] = uVar17;
              refGroupID.m_data[1] = uVar13;
              refGroupID.m_data[2] = uVar12;
              tcu::operator*((tcu *)&local_330,&refGroupID,&localSize->localSize);
              tcu::operator+((tcu *)&refGlobalID,(Vector<unsigned_int,_3> *)&local_330,&refLocalID);
              iVar21 = refGlobalID.m_data[1] * stride.m_data[1] +
                       refGlobalID.m_data[2] * stride.m_data[0] + refGlobalID.m_data[0];
              (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                        (&refValue,this,b,localSize,&refGroupID,&refLocalID);
              uVar20 = outVarInfo.arrayStride * iVar21;
              tcu::Vector<unsigned_int,_3>::Vector(&resValue);
              for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
                resValue.m_data[uVar8] = *(uint *)((long)pvVar7 + uVar8 * 4 + (ulong)uVar20);
              }
              if (uVar16 == 3) {
                bVar3 = tcu::allEqual<unsigned_int,3>(&refValue,&resValue);
                if (!bVar3) {
LAB_005cb1a8:
                  if (iVar4 < 10) {
                    local_330.m_log =
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
                    std::operator<<((ostream *)poVar1,"ERROR: comparison failed at offset ");
                    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                    std::operator<<((ostream *)poVar1,": expected ");
                    local_1b0.m_log = (TestLog *)&refValue;
                    local_1b0._8_4_ = uVar16;
                    pMVar9 = tcu::MessageBuilder::operator<<(&local_330,(LogComps *)&local_1b0);
                    std::operator<<((ostream *)&pMVar9->m_str,", got ");
                    local_3a0._M_dataplus._M_p = (pointer)&resValue;
                    local_3a0._M_string_length._0_4_ = uVar16;
                    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(LogComps *)&local_3a0);
                    tcu::MessageBuilder::operator<<
                              (pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_005cb313:
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330.m_str);
                  }
                  else if (iVar4 == 10) {
                    local_330.m_log =
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330.m_str);
                    std::operator<<((ostream *)&local_330.m_str,"...");
                    tcu::MessageBuilder::operator<<
                              (&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
                    goto LAB_005cb313;
                  }
                  iVar4 = iVar4 + 1;
                }
              }
              else if (refValue.m_data[0] != resValue.m_data[0]) goto LAB_005cb1a8;
              uVar19 = uVar19 + 1;
            }
          }
        }
      }
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

ComputeBuiltinVarCase::IterateResult ComputeBuiltinVarCase::iterate (void)
{
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), string("Iteration") + de::toString(m_subCaseNdx), string("Iteration ") + de::toString(m_subCaseNdx));
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	const SubCase&					subCase			= m_subCases[m_subCaseNdx];
	const deUint32					program			= getProgram(subCase.localSize);

	const tcu::UVec3				globalSize		= subCase.localSize*subCase.numWorkGroups;
	const tcu::UVec2				stride			(globalSize[0]*globalSize[1], globalSize[0]);
	const deUint32					numInvocations	= subCase.localSize[0]*subCase.localSize[1]*subCase.localSize[2]*subCase.numWorkGroups[0]*subCase.numWorkGroups[1]*subCase.numWorkGroups[2];

	const deUint32					outVarIndex		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "Output.result");
	const InterfaceVariableInfo		outVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outVarIndex);
	const deUint32					bufferSize		= numInvocations*outVarInfo.arrayStride;
	Buffer							outputBuffer	(m_context.getRenderContext());

	TCU_CHECK(outVarInfo.arraySize == 0); // Unsized variable.

	m_testCtx.getLog() << TestLog::Message << "Number of work groups = " << subCase.numWorkGroups << TestLog::EndMessage
					   << TestLog::Message << "Work group size = " << subCase.localSize << TestLog::EndMessage;

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, (glw::GLsizeiptr)bufferSize, DE_NULL, GL_STREAM_READ);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer setup failed");

	gl.useProgram(program);
	gl.uniform2uiv(gl.getUniformLocation(program, "u_stride"), 1, stride.getPtr());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program setup failed");

	gl.dispatchCompute(subCase.numWorkGroups[0], subCase.numWorkGroups[1], subCase.numWorkGroups[2]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute() failed");

	{
		const void*	ptr				= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, bufferSize, GL_MAP_READ_BIT);
		int			numFailed		= 0;
		const int	numScalars		= getDataTypeScalarSize(m_varType);
		const int	maxLogPrints	= 10;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");
		TCU_CHECK(ptr);

		for (deUint32 groupZ = 0; groupZ < subCase.numWorkGroups.z(); groupZ++)
		for (deUint32 groupY = 0; groupY < subCase.numWorkGroups.y(); groupY++)
		for (deUint32 groupX = 0; groupX < subCase.numWorkGroups.x(); groupX++)
		for (deUint32 localZ = 0; localZ < subCase.localSize.z(); localZ++)
		for (deUint32 localY = 0; localY < subCase.localSize.y(); localY++)
		for (deUint32 localX = 0; localX < subCase.localSize.x(); localX++)
		{
			const UVec3			refGroupID		(groupX, groupY, groupZ);
			const UVec3			refLocalID		(localX, localY, localZ);
			const UVec3			refGlobalID		= refGroupID * subCase.localSize + refLocalID;
			const deUint32		refOffset		= stride.x()*refGlobalID.z() + stride.y()*refGlobalID.y() + refGlobalID.x();
			const UVec3			refValue		= computeReference(subCase.numWorkGroups, subCase.localSize, refGroupID, refLocalID);

			const deUint32*		resPtr			= (const deUint32*)((const deUint8*)ptr + refOffset*outVarInfo.arrayStride);
			const UVec3			resValue		= readResultVec(resPtr, numScalars);

			if (!compareComps(refValue, resValue, numScalars))
			{
				if (numFailed < maxLogPrints)
					m_testCtx.getLog() << TestLog::Message << "ERROR: comparison failed at offset " << refOffset
														   << ": expected " << LogComps(refValue, numScalars)
														   << ", got " << LogComps(resValue, numScalars)
									   << TestLog::EndMessage;
				else if (numFailed == maxLogPrints)
					m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

				numFailed += 1;
			}
		}

		m_testCtx.getLog() << TestLog::Message << (numInvocations-numFailed) << " / " << numInvocations << " values passed" << TestLog::EndMessage;

		if (numFailed > 0)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Comparison failed");

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	}

	m_subCaseNdx += 1;
	return (m_subCaseNdx < (int)m_subCases.size() && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS) ? CONTINUE : STOP;
}